

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver.cpp
# Opt level: O0

void __thiscall libtorrent::aux::resolver::resolver(resolver *this,io_context *ios)

{
  int local_34;
  duration<long,_std::ratio<1L,_1L>_> local_30 [3];
  io_context *local_18;
  io_context *ios_local;
  resolver *this_local;
  
  local_18 = ios;
  ios_local = (io_context *)this;
  resolver_interface::resolver_interface(&this->super_resolver_interface);
  (this->super_resolver_interface)._vptr_resolver_interface =
       (_func_int **)&PTR_async_resolve_00b8ef10;
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::dns_cache_entry>_>_>
  ::unordered_map(&this->m_cache);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::aux::resolver::failed_dns_cache_entry>_>_>
  ::unordered_map(&this->m_failed_cache);
  this->m_ios = local_18;
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_resolver<boost::asio::io_context>(&this->m_resolver,local_18,(type *)0x0);
  boost::asio::ip::
  basic_resolver<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_resolver<boost::asio::io_context>(&this->m_critical_resolver,local_18,(type *)0x0);
  this->m_max_size = 700;
  local_34 = 0x4b0;
  ::std::chrono::duration<long,std::ratio<1l,1l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1l>> *)local_30,&local_34);
  ::std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            ((duration<long,std::ratio<1l,1000000000l>> *)&this->m_timeout,local_30);
  ::std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(const_boost::system::error_code_&,_const_std::vector<boost::asio::ip::address,_std::allocator<boost::asio::ip::address>_>_&)>_>_>_>
  ::multimap(&this->m_callbacks);
  return;
}

Assistant:

resolver::resolver(io_context& ios)
		: m_ios(ios)
		, m_resolver(ios)
		, m_critical_resolver(ios)
		, m_max_size(700)
		, m_timeout(seconds(1200))
	{}